

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *attr,
          string *name,uint32_t indent)

{
  tinyusdz tVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Animatable<std::array<float,_2UL>_> *this_00;
  ostream *poVar6;
  long lVar7;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  Animatable<std::array<float,_2UL>_> *v;
  stringstream ss;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  v = (Animatable<std::array<float,_2UL>_> *)((ulong)name & 0xffffffff);
  indent_00 = (uint32_t)name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::authored
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                     this);
  if (bVar3) {
    local_1e0 = __return_storage_ptr__;
    this_00 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::get_value
                        ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                          *)this);
    lVar7 = *(long *)(this + 0x210);
    lVar2 = *(long *)(this + 0x208);
    tVar1 = this[600];
    if ((this_00->_blocked == false) && (this_00->_has_value == false)) {
      bVar3 = (this_00->_ts)._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this_00->_ts)._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar3 = false;
    }
    bVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
            is_value_empty((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                            *)this);
    bVar5 = AttrMetas::authored((AttrMetas *)this);
    if (((!bVar5 && !bVar4) & (lVar7 != lVar2 & (byte)tVar1 | bVar3) & (byte)tVar1) == 0) {
      if (((byte)tVar1 & 1) == 0) {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)v,n);
        ::std::operator<<(local_1a8,(string *)&local_200);
        ::std::__cxx11::string::_M_dispose();
        value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
        poVar6 = ::std::operator<<(poVar6," ");
        ::std::operator<<(poVar6,(string *)attr);
        ::std::__cxx11::string::_M_dispose();
        poVar6 = ::std::operator<<(local_1a8," = ");
        print_animatable_default<std::array<float,2ul>>
                  (&local_200,(tinyusdz *)this_00,
                   (Animatable<std::array<float,_2UL>_> *)((ulong)name & 0xffffffff),indent_00);
        ::std::operator<<(poVar6,(string *)&local_200);
      }
      else {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)v,n);
        ::std::operator<<(local_1a8,(string *)&local_200);
        ::std::__cxx11::string::_M_dispose();
        value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
        poVar6 = ::std::operator<<(poVar6," ");
        ::std::operator<<(poVar6,(string *)attr);
      }
      ::std::__cxx11::string::_M_dispose();
      bVar3 = AttrMetas::authored((AttrMetas *)this);
      if (bVar3) {
        poVar6 = ::std::operator<<(local_1a8," (\n");
        print_attr_metas_abi_cxx11_
                  (&local_200,this,(AttrMeta *)(ulong)((uint32_t)name + 1),indent_00);
        poVar6 = ::std::operator<<(poVar6,(string *)&local_200);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)v,n_00);
        poVar6 = ::std::operator<<(poVar6,(string *)&local_1d8);
        ::std::operator<<(poVar6,")");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::operator<<(local_1a8,"\n");
    }
    bVar3 = Animatable<std::array<float,_2UL>_>::has_timesamples(this_00);
    n_02 = n_01;
    if (bVar3) {
      pprint::Indent_abi_cxx11_(&local_200,(pprint *)v,n_01);
      ::std::operator<<(local_1a8,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
      poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
      poVar6 = ::std::operator<<(poVar6," ");
      ::std::operator<<(poVar6,(string *)attr);
      ::std::__cxx11::string::_M_dispose();
      poVar6 = ::std::operator<<(local_1a8,".timeSamples = ");
      print_animatable_timesamples<std::array<float,2ul>>
                (&local_200,(tinyusdz *)this_00,v,indent_00);
      ::std::operator<<(poVar6,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      n_02 = extraout_EDX;
    }
    __return_storage_ptr__ = local_1e0;
    if (*(long *)(this + 0x210) != *(long *)(this + 0x208)) {
      pprint::Indent_abi_cxx11_(&local_200,(pprint *)v,n_02);
      ::std::operator<<(local_1a8,(string *)&local_200);
      ::std::__cxx11::string::_M_dispose();
      value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
      poVar6 = ::std::operator<<(local_1a8,(string *)&local_200);
      poVar6 = ::std::operator<<(poVar6," ");
      ::std::operator<<(poVar6,(string *)attr);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,".connect = ");
      lVar7 = (*(long *)(this + 0x210) - (long)*(Path **)(this + 0x208)) / 0xd0;
      if (lVar7 == 0) {
        ::std::operator<<(local_1a8,"[InternalError]");
      }
      else if (lVar7 == 1) {
        ::std::operator<<(local_1a8,*(Path **)(this + 0x208));
      }
      else {
        ::std::operator<<(local_1a8,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x208))
        ;
      }
      ::std::operator<<(local_1a8,"\n");
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}